

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FileOptions *pFVar1;
  string *element_name;
  FileOptions *pFVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  long lVar6;
  string local_78;
  FileDescriptor *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (0 < *(int *)(file + 0x2c)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      ValidateMessageOptions
                (this,(Descriptor *)(*(long *)(file + 0x68) + lVar5),
                 (DescriptorProto *)
                 ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar6]);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (lVar6 < *(int *)(file + 0x2c));
  }
  if (0 < *(int *)(file + 0x30)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      ValidateEnumOptions(this,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar5),
                          (EnumDescriptorProto *)
                          ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar6]);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x50;
    } while (lVar6 < *(int *)(file + 0x30));
  }
  if (0 < *(int *)(file + 0x34)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      ValidateServiceOptions
                (this,(ServiceDescriptor *)(*(long *)(file + 0x78) + lVar5),
                 (ServiceDescriptorProto *)
                 ((proto->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar6]);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x30;
    } while (lVar6 < *(int *)(file + 0x34));
  }
  if (0 < *(int *)(file + 0x38)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      ValidateFieldOptions
                (this,(FieldDescriptor *)(*(long *)(file + 0x80) + lVar5),
                 (FieldDescriptorProto *)
                 ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar6]);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x98;
    } while (lVar6 < *(int *)(file + 0x38));
  }
  if (file != (FileDescriptor *)0x0) {
    pFVar1 = *(FileOptions **)(file + 0x88);
    pFVar2 = FileOptions::default_instance();
    if ((pFVar1 != pFVar2) && (*(int *)(*(long *)(file + 0x88) + 0xa4) == 3)) goto LAB_002cd241;
  }
  if (0 < *(int *)(file + 0x20)) {
    lVar5 = 0;
    do {
      if (*(once_flag **)(file + 0x18) != (once_flag *)0x0) {
        local_78._M_dataplus._M_p = (pointer)file;
        std::
        call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                  (*(once_flag **)(file + 0x18),FileDescriptor::DependenciesOnceInit,
                   (FileDescriptor **)&local_78);
      }
      lVar6 = *(long *)(*(long *)(file + 0x48) + lVar5 * 8);
      if (lVar6 != 0) {
        pFVar1 = *(FileOptions **)(lVar6 + 0x88);
        pFVar2 = FileOptions::default_instance();
        if ((pFVar1 != pFVar2) && (*(int *)(*(long *)(lVar6 + 0x88) + 0xa4) == 3)) {
          if (*(once_flag **)(file + 0x18) != (once_flag *)0x0) {
            local_78._M_dataplus._M_p = (pointer)file;
            std::
            call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                      (*(once_flag **)(file + 0x18),FileDescriptor::DependenciesOnceInit,
                       (FileDescriptor **)&local_78);
          }
          element_name = (string *)**(undefined8 **)(*(long *)(file + 0x48) + lVar5 * 8);
          if (*(once_flag **)(file + 0x18) != (once_flag *)0x0) {
            local_58 = file;
            std::
            call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                      (*(once_flag **)(file + 0x18),FileDescriptor::DependenciesOnceInit,&local_58);
          }
          std::operator+(&local_50,
                         "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          **(undefined8 **)(*(long *)(file + 0x48) + lVar5 * 8));
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar4) {
            local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
            local_78.field_2._8_8_ = plVar3[3];
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          }
          else {
            local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
            local_78._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_78._M_string_length = plVar3[1];
          *plVar3 = (long)paVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          AddError(this,element_name,&proto->super_Message,IMPORT,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          break;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(file + 0x20));
  }
LAB_002cd241:
  if (*(int *)(file + 0x3c) == 3) {
    ValidateProto3(this,file,proto);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
            file->dependency(i)->name(), proto,
            DescriptorPool::ErrorCollector::IMPORT,
            "Files that do not use optimize_for = LITE_RUNTIME cannot import "
            "files which do use this option.  This file is not lite, but it "
            "imports \"" +
                file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
  if (file->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    ValidateProto3(file, proto);
  }
}